

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::PrintGeneratorList(cmake *this)

{
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  cmDocumentation doc;
  
  cmDocumentation::cmDocumentation(&doc);
  GetGeneratorsDocumentation(&generators,this);
  cmDocumentation::AppendSection(&doc,"Generators",&generators);
  std::operator<<((ostream *)&std::cerr,"\n");
  cmDocumentation::PrintDocumentation(&doc,ListGenerators,(ostream *)&std::cerr);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&generators);
  cmDocumentation::~cmDocumentation(&doc);
  return;
}

Assistant:

void cmake::PrintGeneratorList()
{
#ifndef CMAKE_BOOTSTRAP
  cmDocumentation doc;
  auto generators = this->GetGeneratorsDocumentation();
  doc.AppendSection("Generators", generators);
  std::cerr << "\n";
  doc.PrintDocumentation(cmDocumentation::ListGenerators, std::cerr);
#endif
}